

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-think-dungeon.c
# Opt level: O0

_Bool borg_think_dungeon_munchkin(void)

{
  uint8_t uVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  borg_grid *pbVar4;
  loc grid1;
  loc grid1_00;
  loc grid1_01;
  loc grid1_02;
  chunk_conflict *c;
  _Bool _Var5;
  _Bool _Var6;
  borg_need bVar7;
  square_conflict *psVar9;
  loc lVar10;
  wchar_t wVar8;
  loc lVar11;
  int y_00;
  int x_00;
  loc_conflict lVar12;
  long lVar13;
  borg_grid *tmp_ag_2;
  borg_grid *tmp_ag_1;
  borg_grid *tmp_ag;
  borg_need need;
  uint8_t feat;
  borg_grid *ag;
  int closeness;
  int y;
  int x;
  int ii;
  int i;
  int b_j;
  int j;
  int bb_j;
  _Bool safe_place;
  
  b_j = (int)z_info->max_range;
  ii = -1;
  ag._4_4_ = 8;
  _need = borg_grids[borg.c.y] + borg.c.x;
  lVar12.y = borg.c.y;
  lVar12.x = borg.c.x;
  psVar9 = square((chunk *)cave,lVar12);
  uVar1 = psVar9->feat;
  borg_notice(true);
  if ((borg.trait[0x69] == 0) || (borg.trait[0x6c] != 0)) {
    borg_note("# Leaving munchkin Mode. (Town or Weak)");
    borg.munchkin_mode = false;
    j._3_1_ = false;
  }
  else {
    if ((uVar1 == '\x06') && (_need->feat != '\x06')) {
      for (x = 0; (x < track_more.num &&
                  ((track_more.x[x] != borg.c.x || (track_more.y[x] != borg.c.y)))); x = x + 1) {
      }
      if ((x == track_more.num) && (x < track_more.size)) {
        track_more.x[x] = borg.c.x;
        track_more.y[x] = borg.c.y;
        track_more.num = track_more.num + 1;
      }
      _need->feat = '\x06';
    }
    if ((uVar1 == '\x05') && (_need->feat != '\x05')) {
      for (x = 0; x < track_less.num; x = x + 1) {
      }
      if ((x == track_less.num) && (x < track_less.size)) {
        track_less.x[x] = borg.c.x;
        track_less.y[x] = borg.c.y;
        track_less.num = track_less.num + 1;
      }
      _need->feat = '\x05';
    }
    if ((borg.trait[0x69] == 1) && (track_more.num == 0)) {
      borg.munchkin_mode = false;
      j._3_1_ = false;
    }
    else if ((track_more.num == 0) && (track_less.num == 0)) {
      borg_note("# Leaving Munchkin Mode. (No Stairs seen)");
      borg.munchkin_mode = false;
      j._3_1_ = false;
    }
    else {
      bVar7 = borg_maintain_light();
      if (bVar7 == BORG_MET_NEED) {
        j._3_1_ = true;
      }
      else {
        if (bVar7 == BORG_UNMET_NEED) {
          borg_note("# Munchkin. (need fuel)");
        }
        if (borg.trait[0x1a] == 0) {
          borg_note("# No Light at all.");
        }
        _Var5 = borg_check_rest(borg.c.y,borg.c.x);
        _Var6 = borg_munchkin_mage();
        if (_Var6) {
          j._3_1_ = true;
        }
        else {
          _Var6 = borg_munchkin_melee();
          if (_Var6) {
            j._3_1_ = true;
          }
          else if ((_Var5) && (_Var6 = borg_use_things(), _Var6)) {
            j._3_1_ = true;
          }
          else if ((borg.trait[0x6d] == 0) || (_Var6 = borg_use_things(), !_Var6)) {
            if ((_Var5) && (_Var6 = borg_wear_stuff(), _Var6)) {
              j._3_1_ = true;
            }
            else if ((_Var5) && (_Var6 = borg_remove_stuff(), _Var6)) {
              j._3_1_ = true;
            }
            else if ((_Var5) && (_Var6 = borg_drop_junk(), _Var6)) {
              j._3_1_ = true;
            }
            else if ((_Var5) && (_Var6 = borg_play_magic(true), _Var6)) {
              j._3_1_ = true;
            }
            else {
              _Var6 = borg_flow_old(L'\x02');
              if (_Var6) {
                j._3_1_ = true;
              }
              else if ((_Var5) && (_Var6 = borg_flow_take_lunal(true,L'\x05'), _Var6)) {
                j._3_1_ = true;
              }
              else if ((_Var5) && (_Var6 = borg_recover(), _Var6)) {
                j._3_1_ = true;
              }
              else {
                borg_note("# Fleeing level. Munchkin Mode");
                borg.goal.fleeing_munchkin = true;
                borg.goal.fleeing = true;
                if (borg.trait[0x69] < 0xb) {
                  ag._4_4_ = (borg.trait[0x23] - borg.trait[0x69]) + 8;
                }
                if (((track_less.num != 0) &&
                    (borg_items[(int)(((uint)z_info->pack_size - borg.trait[0x9e]) + -2)].iqty !=
                     '\0')) && ((_Var5 || ((_need->feat == '\x05' || (borg.trait[0x1a] == 0)))))) {
                  pbVar4 = borg_grids[borg.c.y];
                  lVar13 = (long)borg.c.x;
                  for (x = 0; x < track_less.num; x = x + 1) {
                    wVar2 = track_less.x[x];
                    wVar3 = track_less.y[x];
                    lVar10 = loc(wVar2,wVar3);
                    lVar11.y = borg.c.y;
                    lVar11.x = borg.c.x;
                    wVar8 = distance(lVar11,lVar10);
                    _Var6 = borg_projectable(wVar3,wVar2,borg.c.y,borg.c.x);
                    wVar2 = ii;
                    if (((_Var6) && (wVar2 = wVar8, ii <= wVar8)) && (ii != -1)) {
                      wVar2 = ii;
                    }
                    ii = wVar2;
                  }
                  if ((borg.trait[0x69] == 1) && (track_less.num != 0)) {
                    ag._4_4_ = 0x14;
                  }
                  if (((ii < ag._4_4_) && (_Var5)) || (pbVar4[lVar13].feat == '\x05')) {
                    borg_note("# Munchkin Mode.  Power Climb (needing to sell). ");
                    borg.goal.less = true;
                    _Var6 = borg_flow_old(L'\a');
                    if (_Var6) {
                      return true;
                    }
                    _Var6 = borg_flow_stair_less(7,true);
                    if (_Var6) {
                      borg_note("# Looking for stairs. Munchkin Mode (needing to sell).");
                      return true;
                    }
                    if ((pbVar4[lVar13].feat == '\x05') && (((player->opts).opt[0x20] & 1U) == 0)) {
                      borg_keypress(0x3c);
                      return true;
                    }
                  }
                }
                if (((track_less.num != 0) && (borg_cfg[3] < borg.trait[0x69])) &&
                   ((_Var5 || (_need->feat == '\x05')))) {
                  pbVar4 = borg_grids[borg.c.y];
                  lVar13 = (long)borg.c.x;
                  ii = -1;
                  for (x = 0; x < track_less.num; x = x + 1) {
                    wVar2 = track_less.x[x];
                    wVar3 = track_less.y[x];
                    lVar11 = loc(wVar2,wVar3);
                    lVar10.y = borg.c.y;
                    lVar10.x = borg.c.x;
                    wVar8 = distance(lVar10,lVar11);
                    _Var6 = borg_projectable(wVar3,wVar2,borg.c.y,borg.c.x);
                    if ((_Var6) && (((wVar8 < ii || (ii == -1)) && (ii = wVar8, wVar8 < b_j)))) {
                      b_j = wVar8;
                    }
                  }
                  if (((ii < ag._4_4_) && (_Var5)) || (pbVar4[lVar13].feat == '\x05')) {
                    borg_note("# Munchkin Mode.  Power Climb. ");
                    borg.goal.less = true;
                    _Var6 = borg_flow_old(L'\a');
                    if (_Var6) {
                      return true;
                    }
                    _Var6 = borg_flow_stair_less(7,true);
                    if (_Var6) {
                      borg_note("# Looking for stairs. Munchkin Mode.");
                      return true;
                    }
                    if ((pbVar4[lVar13].feat == '\x05') && (((player->opts).opt[0x20] & 1U) == 0)) {
                      borg_keypress(0x3c);
                      return true;
                    }
                  }
                }
                if (((track_more.num != 0) && (borg.trait[0x69] < borg_cfg[3])) &&
                   ((_Var5 || (_need->feat == '\x06')))) {
                  ii = -1;
                  if (0 < track_more.num) {
                    borg_note("# Munchkin Mode: I know of a down stair.");
                  }
                  for (x = 0; x < track_more.num; x = x + 1) {
                    wVar2 = track_more.x[x];
                    wVar3 = track_more.y[x];
                    lVar11 = loc(wVar2,wVar3);
                    grid1.y = borg.c.y;
                    grid1.x = borg.c.x;
                    wVar8 = distance(grid1,lVar11);
                    _Var6 = borg_projectable(wVar3,wVar2,borg.c.y,borg.c.x);
                    wVar2 = ii;
                    if (((_Var6) && (wVar2 = wVar8, ii <= wVar8)) && (ii != -1)) {
                      wVar2 = ii;
                    }
                    ii = wVar2;
                  }
                  if (((ii < ag._4_4_) && (_Var5)) ||
                     ((_need->feat == '\x06' || (borg.trait[0x69] == 1)))) {
                    borg_note("# Munchkin Mode.  Power Diving. ");
                    _Var6 = borg_flow_old(L'\a');
                    if (_Var6) {
                      return true;
                    }
                    _Var6 = borg_flow_stair_more(7,true,false);
                    if (_Var6) {
                      return true;
                    }
                    if (_need->feat == '\x06') {
                      borg_keypress(0x3e);
                      return true;
                    }
                  }
                }
                if ((((track_less.num != 0) && (borg.trait[0x69] != 1)) && (_Var5)) ||
                   (_need->feat == '\x05')) {
                  pbVar4 = borg_grids[borg.c.y];
                  lVar13 = (long)borg.c.x;
                  for (x = 0; x < track_less.num; x = x + 1) {
                    wVar2 = track_less.x[x];
                    wVar3 = track_less.y[x];
                    lVar11 = loc(wVar2,wVar3);
                    grid1_00.y = borg.c.y;
                    grid1_00.x = borg.c.x;
                    wVar8 = distance(grid1_00,lVar11);
                    _Var6 = borg_projectable(wVar3,wVar2,borg.c.y,borg.c.x);
                    wVar2 = ii;
                    if (((_Var6) && (wVar2 = wVar8, ii <= wVar8)) && (ii != -1)) {
                      wVar2 = ii;
                    }
                    ii = wVar2;
                  }
                  if (((ii < ag._4_4_) && (_Var5)) || (pbVar4[lVar13].feat == '\x05')) {
                    borg_note("# Munchkin Mode.  Power Climb. ");
                    borg.goal.less = true;
                    _Var6 = borg_flow_old(L'\a');
                    if (_Var6) {
                      return true;
                    }
                    _Var6 = borg_flow_stair_less(7,true);
                    if (_Var6) {
                      borg_note("# Looking for stairs. Munchkin Mode.");
                      return true;
                    }
                    if ((pbVar4[lVar13].feat == '\x05') && (((player->opts).opt[0x20] & 1U) == 0)) {
                      borg_keypress(0x3c);
                      return true;
                    }
                  }
                }
                if ((1 < borg.trait[0x69]) || (!_Var5)) {
                  _Var5 = borg_flow_old(L'\a');
                  if (_Var5) {
                    return true;
                  }
                  borg_note("# Munchkin Mode.  Any Stair. ");
                  for (x = 0; c = cave, x < 8; x = x + 1) {
                    y_00 = borg.c.y + ddy_ddd[x];
                    x_00 = borg.c.x + ddx_ddd[x];
                    lVar12 = (loc_conflict)loc(x_00,y_00);
                    _Var5 = square_in_bounds((chunk *)c,lVar12);
                    if ((_Var5) && (_need = borg_grids[y_00] + x_00, _need->kill != '\0')) {
                      for (y = 0; y < track_less.num; y = y + 1) {
                        wVar2 = track_less.x[y];
                        wVar3 = track_less.y[y];
                        lVar11 = loc(wVar2,wVar3);
                        grid1_01.y = borg.c.y;
                        grid1_01.x = borg.c.x;
                        wVar8 = distance(grid1_01,lVar11);
                        _Var5 = borg_projectable(wVar3,wVar2,borg.c.y,borg.c.x);
                        wVar2 = ii;
                        if (((_Var5) && (wVar2 = wVar8, ii <= wVar8)) && (ii != -1)) {
                          wVar2 = ii;
                        }
                        ii = wVar2;
                      }
                      for (y = 0; y < track_more.num; y = y + 1) {
                        wVar2 = track_more.x[y];
                        wVar3 = track_more.y[y];
                        lVar11 = loc(wVar2,wVar3);
                        grid1_02.y = borg.c.y;
                        grid1_02.x = borg.c.x;
                        wVar8 = distance(grid1_02,lVar11);
                        _Var5 = borg_projectable(wVar3,wVar2,borg.c.y,borg.c.x);
                        wVar2 = ii;
                        if (((_Var5) && (wVar2 = wVar8, ii <= wVar8)) && (ii != -1)) {
                          wVar2 = ii;
                        }
                        ii = wVar2;
                      }
                      if (ii < 4) {
                        _Var5 = borg_flow_stair_both(7,false);
                        if (_Var5) {
                          return true;
                        }
                      }
                      else {
                        _Var5 = borg_attack(false);
                        if (_Var5) {
                          return true;
                        }
                      }
                    }
                  }
                  _Var5 = borg_flow_stair_both(7,false);
                  if (_Var5) {
                    return true;
                  }
                  if ((_need->feat == '\x05') && (((player->opts).opt[0x20] & 1U) == 0)) {
                    borg_keypress(0x3c);
                    return true;
                  }
                  if (_need->feat == '\x06') {
                    borg_keypress(0x3e);
                    return true;
                  }
                }
                borg_note("Leaving Munchkin Mode. (End of Mode)");
                borg.munchkin_mode = false;
                borg.goal.fleeing_munchkin = false;
                borg.goal.fleeing = false;
                j._3_1_ = false;
              }
            }
          }
          else {
            j._3_1_ = true;
          }
        }
      }
    }
  }
  return j._3_1_;
}

Assistant:

static bool borg_think_dungeon_munchkin(void)
{
    bool safe_place = false;
    int  bb_j       = z_info->max_range;
    int  j, b_j = -1;
    int  i, ii, x, y;
    int  closeness = 8;

    borg_grid *ag  = &borg_grids[borg.c.y][borg.c.x];

    uint8_t feat   = square(cave, borg.c)->feat;

    enum borg_need need;

    /* examine equipment and swaps */
    borg_notice(true);

    /* Not if starving or in town */
    if (borg.trait[BI_CDEPTH] == 0 || borg.trait[BI_ISWEAK]) {
        borg_note("# Leaving munchkin Mode. (Town or Weak)");
        borg.munchkin_mode = false;
        return false;
    }

    /* if borg is just starting on this level, he may not
     * know that a stair is under him.  Cheat to see if one is
     * there
     */
    if (feat == FEAT_MORE && ag->feat != FEAT_MORE) {

        /* Check for an existing "down stairs" */
        for (i = 0; i < track_more.num; i++) {
            /* We already knew about that one */
            if ((track_more.x[i] == borg.c.x) && (track_more.y[i] == borg.c.y))
                break;
        }

        /* Track the newly discovered "down stairs" */
        if ((i == track_more.num) && (i < track_more.size)) {
            track_more.x[i] = borg.c.x;
            track_more.y[i] = borg.c.y;
            track_more.num++;
        }
        /* tell the array */
        ag->feat = FEAT_MORE;
    }

    if (feat == FEAT_LESS && ag->feat != FEAT_LESS) {

        /* Check for an existing "up stairs" */
        for (i = 0; i < track_less.num; i++) {
            /* We already knew about this one */
            if ((track_less.x[i] == borg.c.x) && (track_less.y[i] == borg.c.y))
                continue;
        }

        /* Track the newly discovered "up stairs" */
        if ((i == track_less.num) && (i < track_less.size)) {
            track_less.x[i] = borg.c.x;
            track_less.y[i] = borg.c.y;
            track_less.num++;
        }

        /* Tell the array */
        ag->feat = FEAT_LESS;
    }

    /* Act normal on 1 unless stairs are seen*/
    if (borg.trait[BI_CDEPTH] == 1 && track_more.num == 0) {
        borg.munchkin_mode = false;
        return false;
    }

    /* If no down stair is known, act normal */
    if (track_more.num == 0 && track_less.num == 0) {
        borg_note("# Leaving Munchkin Mode. (No Stairs seen)");
        borg.munchkin_mode = false;
        return false;
    }

    /** First deal with staying alive **/

    /* Hack -- require light */
    need = borg_maintain_light();
    if (need == BORG_MET_NEED)
        return true;
    else if (need == BORG_UNMET_NEED)
        borg_note("# Munchkin. (need fuel)");

    /* No Light at all */
    if (borg.trait[BI_LIGHT] == 0) {
        borg_note("# No Light at all.");
    }

    /* Define if safe_place is true or not */
    safe_place = borg_check_rest(borg.c.y, borg.c.x);

    /* Can do a little attacking. */
    if (borg_munchkin_mage())
        return true;
    if (borg_munchkin_melee())
        return true;

    /* Consume needed things */
    if (safe_place && borg_use_things())
        return true;

    /* Consume needed things */
    if (borg.trait[BI_ISHUNGRY] && borg_use_things())
        return true;

    /* Wear stuff and see if it's good */
    if (safe_place && borg_wear_stuff())
        return true;

    if (safe_place && borg_remove_stuff())
        return true;

    /* Crush junk if convenient */
    if (safe_place && borg_drop_junk())
        return true;

    /* Learn learn and test useful spells */
    if (safe_place && borg_play_magic(true))
        return true;

    /** Track down some interesting gear **/
    /* XXX Should we allow him great flexibility in retrieving loot? (not always
     * safe?)*/
    /* Continue flowing towards objects */
    if (borg_flow_old(GOAL_TAKE))
        return true;

    /* Borg may be off the stair and a monster showed up. */

    /* Find a (viewable) object */
    if (safe_place && borg_flow_take_lunal(true, 5))
        return true;

    /* Recover from any nasty condition */
    if (safe_place && borg_recover())
        return true;

    /*leave level right away. */
    borg_note("# Fleeing level. Munchkin Mode");
    borg.goal.fleeing_munchkin = true;
    borg.goal.fleeing          = true;

    /* Increase the range of the borg a bit */
    if (borg.trait[BI_CDEPTH] <= 10)
        closeness
            += (borg.trait[BI_CLEVEL] - 10) + (10 - borg.trait[BI_CDEPTH]);

    /* Full of Items - Going up */
    if (track_less.num && (borg_items[PACK_SLOTS - 2].iqty)
        && (safe_place || ag->feat == FEAT_LESS
            || borg.trait[BI_LIGHT] == 0)) {
        borg_grid *tmp_ag = &borg_grids[borg.c.y][borg.c.x];

        /* Check for an existing "up stairs" */
        for (i = 0; i < track_less.num; i++) {
            x = track_less.x[i];
            y = track_less.y[i];

            /* How far is the nearest up stairs */
            j = distance(borg.c, loc(x, y));

            /* Is it reachable or behind a wall? */
            if (!borg_projectable(y, x, borg.c.y, borg.c.x))
                continue;

            /* skip the far ones */
            if (b_j <= j && b_j != -1)
                continue;

            /* track it */
            b_j = j;
        }

        /* if on depth 1, try to venture more to get back to town */
        if (borg.trait[BI_CDEPTH] == 1) {
            if (track_less.num) {
                closeness = 20;
            }
        }

        /* if the upstair is close and safe path, continue */
        if ((b_j < closeness && safe_place) || tmp_ag->feat == FEAT_LESS) {

            /* Note */
            borg_note("# Munchkin Mode.  Power Climb (needing to sell). ");

            /* Set to help borg move better */
            borg.goal.less = true;

            /* Continue leaving the level */
            if (borg_flow_old(GOAL_FLEE))
                return true;

            /* Flow to UpStair */
            if (borg_flow_stair_less(GOAL_FLEE, true)) {
                borg_note(
                    "# Looking for stairs. Munchkin Mode (needing to sell).");

                /* Success */
                return true;
            }

            if (tmp_ag->feat == FEAT_LESS && !OPT(player, birth_force_descend)) {
                /* Take the Up Stair */
                borg_keypress('<');
                return true;
            }
        }
    }

    /* Too deep. trying to gradually move shallow.  Going up */
    if ((track_less.num
            && borg.trait[BI_CDEPTH] > borg_cfg[BORG_MUNCHKIN_DEPTH])
        && (safe_place || ag->feat == FEAT_LESS)) {

        borg_grid *tmp_ag = &borg_grids[borg.c.y][borg.c.x];

        /* Reset */
        b_j = -1;

        /* Check for an existing "up stairs" */
        for (i = 0; i < track_less.num; i++) {
            x = track_less.x[i];
            y = track_less.y[i];

            /* How far is the nearest up stairs */
            j = distance(borg.c, loc(x, y));

            /* Is it reachable or behind a wall? */
            if (!borg_projectable(y, x, borg.c.y, borg.c.x))
                continue;

            /* skip the far ones */
            if (b_j <= j && b_j != -1)
                continue;

            /* track it */
            b_j = j;
            if (b_j < bb_j)
                bb_j = b_j;
        }

        /* if the upstair is close and safe path, continue */
        if ((b_j < closeness && safe_place) || tmp_ag->feat == FEAT_LESS) {

            /* Note */
            borg_note("# Munchkin Mode.  Power Climb. ");

            /* Set to help borg move better */
            borg.goal.less = true;

            /* Continue leaving the level */
            if (borg_flow_old(GOAL_FLEE))
                return true;

            /* Flow to UpStair */
            if (borg_flow_stair_less(GOAL_FLEE, true)) {
                borg_note("# Looking for stairs. Munchkin Mode.");

                /* Success */
                return true;
            }

            if (tmp_ag->feat == FEAT_LESS && !OPT(player, birth_force_descend)) {
                /* Take the Up Stair */
                borg_keypress('<');
                return true;
            }
        }
    }

    /* Going down */
    if ((track_more.num
            && borg.trait[BI_CDEPTH] < borg_cfg[BORG_MUNCHKIN_DEPTH])
        && (safe_place || ag->feat == FEAT_MORE)) {
        /* Reset */
        b_j = -1;

        if (track_more.num >= 1)
            borg_note("# Munchkin Mode: I know of a down stair.");

        /* Check for an existing "down stairs" */
        for (i = 0; i < track_more.num; i++) {
            x = track_more.x[i];
            y = track_more.y[i];

            /* How far is the nearest down stairs */
            j = distance(borg.c, loc(x, y));

            /* Is it reachable or behind a wall? */
            if (!borg_projectable(y, x, borg.c.y, borg.c.x))
                continue;

            /* skip the far ones */
            if (b_j <= j && b_j != -1)
                continue;

            /* track it */
            b_j = j;
        }

        /* if the downstair is close and path is safe, continue on */
        if ((b_j < closeness && safe_place) || ag->feat == FEAT_MORE
            || borg.trait[BI_CDEPTH] == 1) {
            /* Note */
            borg_note("# Munchkin Mode.  Power Diving. ");

            /* Continue leaving the level */
            if (borg_flow_old(GOAL_FLEE))
                return true;

            /* Flow to DownStair */
            if (borg_flow_stair_more(GOAL_FLEE, true, false))
                return true;

            /* if standing on a stair */
            if (ag->feat == FEAT_MORE) {
                /* Take the DownStair */
                borg_keypress('>');

                return true;
            }
        }
    }

    /* Going up */
    if ((track_less.num && borg.trait[BI_CDEPTH] != 1 && safe_place)
        || ag->feat == FEAT_LESS) {
        borg_grid *tmp_ag = &borg_grids[borg.c.y][borg.c.x];

        /* Check for an existing "up stairs" */
        for (i = 0; i < track_less.num; i++) {
            x = track_less.x[i];
            y = track_less.y[i];

            /* How far is the nearest up stairs */
            j = distance(borg.c, loc(x, y));

            /* Is it reachable or behind a wall? */
            if (!borg_projectable(y, x, borg.c.y, borg.c.x))
                continue;

            /* skip the far ones */
            if (b_j <= j && b_j != -1)
                continue;

            /* track it */
            b_j = j;
        }

        /* if the upstair is close and safe path, continue */
        if ((b_j < closeness && safe_place) || tmp_ag->feat == FEAT_LESS) {

            /* Note */
            borg_note("# Munchkin Mode.  Power Climb. ");

            /* Set to help borg move better */
            borg.goal.less = true;

            /* Continue leaving the level */
            if (borg_flow_old(GOAL_FLEE))
                return true;

            /* Flow to UpStair */
            if (borg_flow_stair_less(GOAL_FLEE, true)) {
                borg_note("# Looking for stairs. Munchkin Mode.");

                /* Success */
                return true;
            }

            if (tmp_ag->feat == FEAT_LESS && !OPT(player, birth_force_descend)) {
                /* Take the Up Stair */
                borg_keypress('<');
                return true;
            }
        }
    }

    /* Special case where the borg is off a stair and there
     * is a monster in LOS.  He could freeze and unhook, or
     * move to the closest stair and risk the run.
     */
    if (borg.trait[BI_CDEPTH] >= 2 || !safe_place) {
        /* Continue fleeing to stair */
        if (borg_flow_old(GOAL_FLEE))
            return true;

        /* Note */
        borg_note("# Munchkin Mode.  Any Stair. ");

        /* Adjacent Monster.  Either attack it, or try to outrun it */
        for (i = 0; i < 8; i++) {
            y = borg.c.y + ddy_ddd[i];
            x = borg.c.x + ddx_ddd[i];

            /* Bounds check */
            if (!square_in_bounds(cave, loc(x, y)))
                continue;

            /* Get the grid */
            ag = &borg_grids[y][x];

            /* Monster is adjacent to the borg */
            if (ag->kill) {
                /* Check for an existing "up stairs" */
                for (ii = 0; ii < track_less.num; ii++) {
                    x = track_less.x[ii];
                    y = track_less.y[ii];

                    /* How far is the nearest up stairs */
                    j = distance(borg.c, loc(x, y));

                    /* Is it reachable or behind a wall? */
                    if (!borg_projectable(y, x, borg.c.y, borg.c.x))
                        continue;

                    /* skip the far ones */
                    if (b_j <= j && b_j != -1)
                        continue;

                    /* track it */
                    b_j = j;
                }

                /* Check for an existing "down stairs" */
                for (ii = 0; ii < track_more.num; ii++) {
                    x = track_more.x[ii];
                    y = track_more.y[ii];

                    /* How far is the nearest down stairs */
                    j = distance(borg.c, loc(x, y));

                    /* Is it reachable or behind a wall? */
                    if (!borg_projectable(y, x, borg.c.y, borg.c.x))
                        continue;

                    /* skip the far ones */
                    if (b_j <= j && b_j != -1)
                        continue;

                    /* track it */
                    b_j = j;
                }

                /* Can the borg risk the run? */
                if (b_j <= 3) {
                    /* Try to find some stairs */
                    if (borg_flow_stair_both(GOAL_FLEE, false))
                        return true;
                } else {
                    /* Try to kill it */
                    if (borg_attack(false))
                        return true;
                }
            } /* Adjacent to kill */
        } /* Scanning neighboring grids */

        /* Try to find some stairs */
        if (borg_flow_stair_both(GOAL_FLEE, false))
            return true;
        if (ag->feat == FEAT_LESS && !OPT(player, birth_force_descend)) {
            /* Take the Up Stair */
            borg_keypress('<');
            return true;
        }
        if (ag->feat == FEAT_MORE) {
            /* Take the Stair */
            borg_keypress('>');
            return true;
        }
    }

    /* return to normal borg_think_dungeon */
    borg_note("Leaving Munchkin Mode. (End of Mode)");
    borg.munchkin_mode = false;
    borg.goal.fleeing = borg.goal.fleeing_munchkin = false;
    return false;
}